

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerLoadVar(Lowerer *this,Instr *instr,Opnd *opnd)

{
  Instr *pIVar1;
  
  IR::Instr::SetSrc1(instr,opnd);
  pIVar1 = LowererMD::ChangeToAssign(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLoadVar(IR::Instr *instr, IR::Opnd *opnd)
{
    instr->SetSrc1(opnd);
    return m_lowererMD.ChangeToAssign(instr);
}